

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData * GenerateSystem24Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  int gap3_bytes;
  Sector *s;
  Sector *sector;
  BitstreamTrackBuilder bitbuf;
  BitstreamTrackBuilder BStack_a8;
  
  bVar2 = IsSystem24Track(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&BStack_a8,_500K,MFM);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start; sector != pSVar1; sector = sector + 1) {
      gap3_bytes = 0x34;
      if (5 < (sector->header).sector) {
        gap3_bytes = 0x29;
      }
      TrackBuilder::addSector(&BStack_a8.super_TrackBuilder,sector,gap3_bytes);
    }
    bitstream = BitstreamTrackBuilder::buffer(&BStack_a8);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    if (BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("IsSystem24Track(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x92,"TrackData GenerateSystem24Track(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateSystem24Track(const CylHead& cylhead, const Track& track)
{
    assert(IsSystem24Track(track));

    BitstreamTrackBuilder bitbuf(DataRate::_500K, Encoding::MFM);

    for (auto& s : track)
    {
        auto gap3{ (s.header.sector < 6) ? 52 : 41 };
        bitbuf.addSector(s, gap3);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}